

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void duckdb::SQLLogicTestLogger::LoadDatabaseFail(string *dbpath,string *message)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_30,"Failed to load database ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dbpath);
  PrintErrorHeader(&local_50,0,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  PrintLineSep();
  std::operator+(&local_30,"Error message: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 &local_30,anon_var_dwarf_88e480 + 8);
  Log(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  PrintLineSep();
  return;
}

Assistant:

void SQLLogicTestLogger::LoadDatabaseFail(const string &dbpath, const string &message) {
	PrintErrorHeader(string(), 0, "Failed to load database " + dbpath);
	PrintLineSep();
	Log("Error message: " + message + "\n");
	PrintLineSep();
}